

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

void __thiscall Graph<Node>::Graph(Graph<Node> *this,Graph<Node> *other)

{
  undefined8 *puVar1;
  int *piVar2;
  
  vector<NodeList<Node>_>::vector(&this->G);
  puVar1 = (undefined8 *)operator_new__(0x14);
  *puVar1 = 1;
  puVar1[1] = 0;
  *(undefined4 *)(puVar1 + 2) = 0;
  (this->edges).vect = (Edge *)(puVar1 + 1);
  (this->edges)._size = 0;
  (this->edges)._capacity = 1;
  vector<vector<int>_>::vector(&this->minDist);
  vector<vector<int>_>::vector(&this->nextNodeInPath);
  vector<vector<int>_>::vector(&this->compList);
  piVar2 = (int *)operator_new__(4);
  *piVar2 = 0;
  (this->inCC).vect = piVar2;
  (this->inCC)._size = 0;
  (this->inCC)._capacity = 1;
  operator=(this,other);
  return;
}

Assistant:

Graph(const Graph &other) {
        *this = other;
//        _nodeCnt = other._nodeCnt;
//        _edgeCnt = other._edgeCnt;
//        G = other.G;
//        edges = other.edges;
//        minDist = other.minDist;
//        nextNodeInPath = other.nextNodeInPath;
    }